

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcHashEntryPpDefine::parse_expansion(CTcHashEntryPpDefine *this,size_t *argvlen)

{
  CTcTokString *pCVar1;
  char cVar2;
  CTcTokenizer *pCVar3;
  tc_toktyp_t tVar4;
  wchar_t wVar5;
  int iVar6;
  CVmHashEntry *pCVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 in_R8;
  undefined7 uVar11;
  long lVar12;
  size_t __n;
  long lVar13;
  ulong uVar14;
  CTcToken tok;
  tok_embed_ctx ec;
  undefined1 local_151;
  char *local_148;
  utf8_ptr local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  size_t *local_118;
  CTcTokenizer *local_110;
  CTcToken local_108;
  tok_embed_ctx local_e0;
  
  if ((this->super_CTcHashEntryPp).argc_ == 0) {
    this->expan_ = this->orig_expan_;
    this->expan_len_ = this->orig_expan_len_;
    return;
  }
  local_e0.level = 0;
  local_e0.s = (tok_embed_level *)0x0;
  uVar9 = this->orig_expan_len_;
  pCVar1 = &G_tok->defbuf_;
  local_110 = G_tok;
  local_118 = argvlen;
  (*(G_tok->defbuf_)._vptr_CTcTokString[2])();
  local_148 = this->orig_expan_;
  lVar12 = 0;
  local_138.p_ = local_148;
  do {
    local_130 = lVar12;
    do {
      while (tVar4 = CTcTokenizer::next_on_line(&local_138,&local_108,&local_e0,0),
            pcVar8 = local_108.text_, tVar4 != TOKT_SYM) {
        if (tVar4 == TOKT_EOF) {
          if (local_148 <= local_108.text_ && (long)local_108.text_ - (long)local_148 != 0) {
            iVar6 = (*pCVar1->_vptr_CTcTokString[10])(pCVar1);
            memcpy((void *)(local_130 + CONCAT44(extraout_var_02,iVar6)),local_148,
                   (long)local_108.text_ - (long)local_148);
          }
          pCVar3 = local_110;
          (*(local_110->defbuf_)._vptr_CTcTokString[0xb])(pCVar1,uVar9);
          pcVar8 = lib_copy_str((pCVar3->defbuf_).buf_);
          this->expan_ = pcVar8;
          this->expan_len_ = uVar9;
          return;
        }
      }
      pCVar7 = CVmHashTable::find((this->super_CTcHashEntryPp).params_table_,local_108.text_,
                                  local_108.text_len_);
    } while (pCVar7 == (CVmHashEntry *)0x0);
    local_120 = (long)*(int *)&pCVar7->field_0x24;
    sVar10 = local_118[local_120];
    uVar11 = (undefined7)((ulong)in_R8 >> 8);
    lVar12 = 2;
    if ((((this->super_CTcHashEntryPp).field_0x44 & 2) == 0) ||
       (*(int *)&pCVar7->field_0x24 != (this->super_CTcHashEntryPp).argc_ + -1)) {
      in_R8 = CONCAT71(uVar11,1);
      local_151 = 1;
    }
    else {
      wVar5 = utf8_ptr::s_getch(local_138.p_);
      in_R8 = CONCAT71(uVar11,1);
      if (wVar5 != L'#') goto LAB_002211a2;
      if ((*(int *)(local_138.p_ + 4) == 0x68636165 && *(int *)(local_138.p_ + 1) == 0x65726f66) &&
         ((wVar5 = utf8_ptr::s_getch_at(local_138.p_,8), 0x7f < (uint)wVar5 ||
          ((wVar5 != L'_' &&
           (iVar6 = isalpha(wVar5), (uint)(wVar5 + L'\xffffffc6') < 0xfffffff6 && iVar6 == 0)))))) {
        sVar10 = sVar10 + 8;
        local_151 = 5;
      }
      else if ((*(long *)(local_138.p_ + 1) == 0x746e756f63677261) &&
              ((wVar5 = utf8_ptr::s_getch_at(local_138.p_,9), 0x7f < (uint)wVar5 ||
               ((wVar5 != L'_' &&
                (iVar6 = isalpha(wVar5), (uint)(wVar5 + L'\xffffffc6') < 0xfffffff6 && iVar6 == 0)))
               ))) {
        sVar10 = sVar10 + 9;
        local_151 = 6;
      }
      else {
        if ((*(int *)(local_138.p_ + 4) != 0x7974706d || *(int *)(local_138.p_ + 1) != 0x6d656669)
           || ((wVar5 = utf8_ptr::s_getch_at(local_138.p_,8), (uint)wVar5 < 0x80 &&
               ((wVar5 == L'_' ||
                (iVar6 = isalpha(wVar5), 0xfffffff5 < (uint)(wVar5 + L'\xffffffc6') || iVar6 != 0)))
               ))) {
          in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
          if (*(long *)(local_138.p_ + 1) == 0x7974706d656e6669) {
            wVar5 = utf8_ptr::s_getch_at(local_138.p_,9);
            if (0x7f < (uint)wVar5) {
LAB_00221334:
              sVar10 = sVar10 + 9;
              local_151 = 8;
              goto LAB_00221342;
            }
            in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
            if (wVar5 != L'_') {
              iVar6 = isalpha(wVar5);
              in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
              if ((uint)(wVar5 + L'\xffffffc6') < 0xfffffff6 && iVar6 == 0) goto LAB_00221334;
            }
          }
LAB_002211a2:
          local_151 = 1;
          goto LAB_002211b3;
        }
        sVar10 = sVar10 + 8;
        local_151 = 7;
      }
LAB_00221342:
      lVar12 = 1;
      in_R8 = 0;
    }
LAB_002211b3:
    local_124 = (undefined4)in_R8;
    uVar14 = (uVar9 - sVar10) + lVar12;
    if (uVar9 < uVar14) {
      (*pCVar1->_vptr_CTcTokString[2])(pCVar1,uVar14);
    }
    __n = (long)pcVar8 - (long)local_148;
    lVar13 = local_130;
    if (local_148 <= pcVar8 && __n != 0) {
      iVar6 = (*pCVar1->_vptr_CTcTokString[10])(pCVar1);
      memcpy((void *)(CONCAT44(extraout_var,iVar6) + local_130),local_148,__n);
      lVar13 = __n + local_130;
    }
    local_148 = pcVar8 + sVar10;
    iVar6 = (*pCVar1->_vptr_CTcTokString[10])(pCVar1);
    lVar12 = lVar13 + 1;
    *(undefined1 *)(CONCAT44(extraout_var_00,iVar6) + lVar13) = local_151;
    uVar9 = uVar14;
    if ((char)local_124 != '\0') {
      cVar2 = (char)local_120;
      iVar6 = (*pCVar1->_vptr_CTcTokString[10])();
      *(char *)(CONCAT44(extraout_var_01,iVar6) + 1 + lVar13) = cVar2 + '\x01';
      lVar12 = lVar13 + 2;
    }
  } while( true );
}

Assistant:

void CTcHashEntryPpDefine::parse_expansion(const size_t *argvlen)
{
    /*
     *   If there are arguments, scan the expansion for formal parameter
     *   names.  For each one we find, replace it with the special
     *   TOK_MACRO_FORMAL_FLAG character followed by a one-byte value giving
     *   the argument index.  This special sequence is less costly to find
     *   when we're expanding the macros - by doing the search here, we only
     *   need to do it once, rather than each time we expand the macro.  
     */
    if (argc_ != 0)
    {
        utf8_ptr src;
        size_t dstofs;
        tc_toktyp_t typ;
        CTcToken tok;
        const char *start;
        tok_embed_ctx ec;
        size_t expan_len = orig_expan_len_;

        /* 
         *   Generate our modified expansion text in the tokenizer's macro
         *   definition scratch buffer.  Initially, make sure we have room
         *   for a copy of the text; we'll resize the buffer later if we find
         *   we need even more.  
         */
        CTcTokString *defbuf = &G_tok->defbuf_;
        defbuf->ensure_space(expan_len);

        /* scan for argument names, and replace them */
        for (start = orig_expan_, dstofs = 0, src.set((char *)orig_expan_) ;; )
        {
            /* get the next token */
            typ = CTcTokenizer::next_on_line(&src, &tok, &ec, FALSE);

            /* if we've reached the end of the expansion, we're done */
            if (typ == TOKT_EOF)
                break;

            /* 
             *   If this is a formal parameter name, we'll replace it with a
             *   special two-byte sequence; otherwise, we'll keep it
             *   unchanged.  
             */
            if (typ == TOKT_SYM)
            {
                /* look up the symbol in our argument table */
                CTcHashEntryPpArg *entry =
                    (CTcHashEntryPpArg *)params_table_->find(
                        tok.get_text(), tok.get_text_len());

                /* check if we found it */
                if (entry != 0)
                {
                    /* get the argument number from the entry */
                    int i = entry->get_argnum();
                    
                    /* get the length of the formal name */
                    size_t arg_len = argvlen[i];

                    /* 
                     *   the normal replacement length for a formal parameter
                     *   is two bytes - one byte for the flag, and one for
                     *   the formal parameter index 
                     */
                    size_t repl_len = 2;

                    /* by default, the flag byte is the formal flag */
                    char flag_byte = TOK_MACRO_FORMAL_FLAG;

                    /*
                     *   Check for special varargs control suffixes.  If we
                     *   matched the last argument name, and this is a
                     *   varargs macro, we might have a suffix.  
                     */
                    if (has_varargs_
                        && i == argc_ - 1
                        && src.getch() == '#')
                    {
                        /* check for the various suffixes */
                        if (memcmp(src.getptr() + 1, "foreach", 7) == 0
                            && !is_sym(src.getch_at(8)))
                        {
                            /* 
                             *   include the suffix length in the token
                             *   length 
                             */
                            arg_len += 8;
                            
                            /* 
                             *   the flag byte is the #foreach flag, which is
                             *   a one-byte sequence 
                             */
                            flag_byte = TOK_MACRO_FOREACH_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "argcount", 8) == 0
                                 && !is_sym(src.getch_at(9)))
                        {
                            /* 
                             *   include the suffix length in the token
                             *   length 
                             */
                            arg_len += 9;
                            
                            /* 
                             *   the flag byte is the #argcount flag, which
                             *   is a one-byte sequence 
                             */
                            flag_byte = TOK_MACRO_ARGCOUNT_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "ifempty", 7) == 0
                                 && !is_sym(src.getch_at(8)))
                        {
                            /* include the length */
                            arg_len += 8;
                            
                            /* set the one-byte flag */
                            flag_byte = TOK_MACRO_IFEMPTY_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "ifnempty", 8) == 0
                                 && !is_sym(src.getch_at(9)))
                        {
                            /* include the length */
                            arg_len += 9;
                            
                            /* set the one-byte flag */
                            flag_byte = TOK_MACRO_IFNEMPTY_FLAG;
                            repl_len = 1;
                        }
                    }
                    
                    /* 
                     *   calculate the new length - we're removing the
                     *   argument name and adding the replacement string in
                     *   its place 
                     */
                    size_t new_len = expan_len + repl_len - arg_len;
                    
                    /* 
                     *   we need two bytes for the replacement - if this is
                     *   more than we're replacing, make sure we have room
                     *   for the extra 
                     */
                    if (new_len > expan_len)
                        defbuf->ensure_space(new_len);
                    
                    /* 
                     *   copy everything up to but not including the formal
                     *   name 
                     */
                    if (tok.get_text() > start)
                    {
                        /* store the text */
                        memcpy(defbuf->get_buf() + dstofs,
                               start, tok.get_text() - start);
                        
                        /* move past the stored text in the output */
                        dstofs += tok.get_text() - start;
                    }
                    
                    /* the next segment starts after this token */
                    start = tok.get_text() + arg_len;
                    
                    /* store the flag byte */
                    defbuf->get_buf()[dstofs++] = flag_byte;
                    
                    /* 
                     *   If appropriate, store the argument index - this
                     *   always fits in one byte because our hard limit on
                     *   formal parameters is less than 128 per macro.  Note
                     *   that we add one to the index so that we never store
                     *   a zero byte, to avoid any potential confusion with a
                     *   null terminator byte.  
                     */
                    if (repl_len > 1)
                        defbuf->get_buf()[dstofs++] = (char)(i + 1);
                    
                    /* remember the new length */
                    expan_len = new_len;
                }
            }
        }

        /* copy the last segment */
        if (tok.get_text() > start)
            memcpy(defbuf->get_buf() + dstofs, start, tok.get_text() - start);

        /* set the new length */
        defbuf->set_text_len(expan_len);

        /* save the parsed expansion */
        expan_ = lib_copy_str(defbuf->get_text());
        expan_len_ = expan_len;
    }
    else
    {
        /* 
         *   There are no arguments, so there's no parsing we need to do.
         *   Just use the original as the parsed expansion.  
         */
        expan_ = orig_expan_;
        expan_len_ = orig_expan_len_;
    }
}